

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myapi.hpp
# Opt level: O2

Error __thiscall fake::MyFakeAPI::Call(MyFakeAPI *this,int x)

{
  result_type rVar1;
  result_type rVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Error EVar4;
  uniform_int_distribution<int> dist;
  random_device rd;
  ContextType local_13b0;
  param_type local_13a8;
  random_device local_13a0;
  
  if (x < 0) {
    EVar4 = ErrArgumentNeg::E();
    _Var3 = EVar4.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  }
  else if (x == 0) {
    EVar4 = ErrArgumentZero::E();
    _Var3 = EVar4.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  }
  else {
    std::random_device::random_device(&local_13a0);
    local_13a8._M_a = 0;
    local_13a8._M_b = 3;
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_13a8,&local_13a0);
    rVar2 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_13a8,&local_13a0);
    if (rVar1 < x) {
      if (rVar2 < x) {
        *(undefined8 *)this = 0;
        *(undefined8 *)(this + 8) = 0;
      }
      else {
        local_13b0.randNum1 = rVar1;
        local_13b0.randNum2 = rVar2;
        ErrLERandNum2::E((ErrLERandNum2 *)this,&local_13b0);
      }
    }
    else {
      local_13b0.randNum1 = rVar1;
      local_13b0.randNum2 = rVar2;
      ErrLERandNum1::E((ErrLERandNum1 *)this,&local_13b0);
    }
    std::random_device::~random_device(&local_13a0);
    _Var3._M_pi = extraout_RDX;
  }
  EVar4.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  EVar4.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Error)EVar4.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static gerr::Error Call(int x) {
    if (x < 0) {
      return ErrArgumentNeg::E();
    }
    if (x == 0) {
      return ErrArgumentZero::E();
    }
    std::random_device rd;
    std::uniform_int_distribution<int> dist(0, 3);
    auto const r1 = dist(rd);
    auto const r2 = dist(rd);
    if (x <= r1) {
      return ErrLERandNum1::E({r1, r2});
      // 如果使用 ErrLERandNumComplex 来进行定义，就需要使用 Make 函数
      // return gerr::Make<ErrLERandNumComplex>(r1, r2);
    }
    if (x <= r2) {
      return ErrLERandNum2::E({r1, r2});
    }
    return nullptr;
  }